

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccolumn_bmod.c
# Opt level: O3

int ccolumn_bmod(int jcol,int nseg,singlecomplex *dense,singlecomplex *tempv,int *segrep,int *repfnz
                ,int fpanelc,GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  uint ncol;
  long lVar1;
  singlecomplex *psVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  int iVar8;
  float fVar9;
  uint uVar10;
  int_t iVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  singlecomplex *psVar16;
  int iVar17;
  float *pfVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  int iVar29;
  int ldm;
  float fVar30;
  float fVar34;
  singlecomplex sVar31;
  singlecomplex sVar32;
  singlecomplex sVar33;
  float fVar35;
  float fVar37;
  singlecomplex sVar36;
  float fVar38;
  singlecomplex sVar39;
  float fVar40;
  singlecomplex sVar41;
  singlecomplex sVar42;
  int_t nzlumax;
  void *local_d0;
  int_t *local_c8;
  int_t local_b4;
  singlecomplex *local_b0;
  int_t *local_a8;
  int_t *local_a0;
  ulong local_98;
  singlecomplex *local_90;
  int_t local_88;
  uint local_84;
  long local_80;
  long local_78;
  int *local_70;
  long local_68;
  flops_t *local_60;
  long local_58;
  long local_50;
  int *local_48;
  int *local_40;
  int *local_38;
  
  local_60 = stat->ops;
  local_70 = Glu->xsup;
  local_40 = Glu->supno;
  local_c8 = Glu->lsub;
  local_a8 = Glu->xlsub;
  local_d0 = Glu->lusup;
  local_a0 = Glu->xlusup;
  local_b4 = Glu->nzlumax;
  local_78 = (long)jcol;
  local_68 = (long)local_40[local_78];
  local_b0 = tempv;
  local_88 = local_b4;
  local_48 = repfnz;
  local_38 = segrep;
  if (0 < nseg) {
    uVar14 = (ulong)(uint)nseg;
    local_80 = (long)local_d0 + 0xc;
    local_58 = (long)local_d0 + 4;
    uVar19 = 0;
    do {
      iVar29 = local_38[uVar14 - 1];
      local_98 = uVar19;
      local_90 = (singlecomplex *)uVar14;
      if ((int)local_68 != local_40[iVar29]) {
        iVar13 = local_70[local_40[iVar29]];
        iVar22 = fpanelc;
        if (fpanelc < iVar13) {
          iVar22 = iVar13;
        }
        iVar23 = iVar22 - iVar13;
        iVar17 = local_a0[iVar22] + iVar23;
        iVar21 = local_a8[iVar13] + iVar23;
        iVar20 = local_48[iVar29];
        if (local_48[iVar29] <= fpanelc) {
          iVar20 = fpanelc;
        }
        uVar10 = iVar29 - iVar22;
        iVar8 = local_a8[(long)iVar13 + 1];
        lVar12 = (long)iVar8;
        ldm = iVar8 - local_a8[iVar13];
        iVar25 = iVar21 + uVar10;
        iVar13 = uVar10 + 1 + iVar21;
        iVar27 = iVar29 - iVar20;
        if (iVar27 == 0) {
          if (iVar13 < iVar8) {
            fVar34 = dense[local_c8[iVar25]].i;
            lVar15 = (long)iVar13;
            fVar30 = dense[local_c8[iVar25]].r;
            pfVar18 = (float *)(local_58 + (long)(int)(ldm * uVar10 + iVar17 + uVar10 + 1) * 8);
            do {
              sVar39.r = dense[local_c8[lVar15]].r - (pfVar18[-1] * fVar30 + *pfVar18 * -fVar34);
              sVar39.i = dense[local_c8[lVar15]].i - (pfVar18[-1] * fVar34 + *pfVar18 * fVar30);
              dense[local_c8[lVar15]] = sVar39;
              lVar15 = lVar15 + 1;
              pfVar18 = pfVar18 + 2;
            } while (lVar15 < lVar12);
          }
        }
        else {
          ncol = iVar27 + 1;
          if (iVar27 < 3) {
            iVar29 = local_c8[iVar25];
            iVar17 = (ldm + 1) * uVar10 + iVar17;
            iVar22 = local_c8[(long)iVar25 + -1];
            lVar15 = (long)(iVar17 - ldm);
            fVar35 = dense[iVar22].r;
            fVar37 = dense[iVar22].i;
            fVar30 = dense[iVar29].r;
            fVar34 = dense[iVar29].i;
            if (ncol == 2) {
              fVar3 = *(float *)((long)local_d0 + lVar15 * 8);
              fVar4 = *(float *)((long)local_d0 + lVar15 * 8 + 4);
              sVar31.r = fVar30 - (fVar3 * fVar35 + fVar4 * -fVar37);
              sVar31.i = fVar34 - (fVar3 * fVar37 + fVar4 * fVar35);
              dense[iVar29] = sVar31;
              if (iVar13 < iVar8) {
                lVar15 = local_80 + lVar15 * 8;
                lVar28 = local_80 + (long)iVar17 * 8;
                lVar24 = 0;
                do {
                  fVar30 = *(float *)(lVar28 + -4 + lVar24 * 8);
                  fVar34 = *(float *)(lVar28 + lVar24 * 8);
                  fVar3 = *(float *)(lVar15 + -4 + lVar24 * 8);
                  fVar4 = *(float *)(lVar15 + lVar24 * 8);
                  sVar41.r = dense[local_c8[iVar13 + lVar24]].r -
                             (fVar3 * fVar35 + fVar4 * -fVar37 +
                             fVar30 * sVar31.r + fVar34 * -sVar31.i);
                  sVar41.i = dense[local_c8[iVar13 + lVar24]].i -
                             (fVar3 * fVar37 + fVar4 * fVar35 +
                             fVar30 * sVar31.i + fVar34 * sVar31.r);
                  dense[local_c8[iVar13 + lVar24]] = sVar41;
                  lVar26 = iVar13 + lVar24;
                  lVar24 = lVar24 + 1;
                } while (lVar26 + 1 < lVar12);
              }
            }
            else {
              lVar28 = (long)((iVar17 - ldm) - ldm);
              fVar38 = dense[local_c8[(long)iVar25 + -2]].i;
              fVar40 = -fVar38;
              fVar3 = *(float *)((long)local_d0 + lVar28 * 8 + -8);
              fVar4 = *(float *)((long)local_d0 + lVar28 * 8 + -4);
              fVar5 = *(float *)((long)local_d0 + lVar28 * 8);
              fVar6 = *(float *)((long)local_d0 + lVar28 * 8 + 4);
              fVar9 = dense[local_c8[(long)iVar25 + -2]].r;
              sVar36.r = fVar35 - (fVar3 * fVar9 + fVar4 * fVar40);
              sVar36.i = fVar37 - (fVar3 * fVar38 + fVar4 * fVar9);
              fVar35 = *(float *)((long)local_d0 + lVar15 * 8);
              fVar37 = *(float *)((long)local_d0 + lVar15 * 8 + 4);
              sVar33.r = fVar30 - (fVar5 * fVar9 + fVar6 * fVar40 +
                                  fVar35 * sVar36.r + fVar37 * -sVar36.i);
              sVar33.i = fVar34 - (fVar5 * fVar38 + fVar6 * fVar9 +
                                  fVar35 * sVar36.i + fVar37 * sVar36.r);
              dense[iVar29] = sVar33;
              dense[iVar22] = sVar36;
              if (iVar13 < iVar8) {
                lVar24 = lVar15 * 8 + (long)ldm * -8 + local_80;
                lVar15 = local_80 + lVar15 * 8;
                lVar28 = local_80 + (long)iVar17 * 8;
                lVar26 = 0;
                do {
                  fVar30 = *(float *)(lVar28 + -4 + lVar26 * 8);
                  fVar34 = *(float *)(lVar28 + lVar26 * 8);
                  fVar35 = *(float *)(lVar15 + -4 + lVar26 * 8);
                  fVar37 = *(float *)(lVar15 + lVar26 * 8);
                  fVar3 = *(float *)(lVar24 + -4 + lVar26 * 8);
                  fVar4 = *(float *)(lVar24 + lVar26 * 8);
                  sVar42.r = dense[local_c8[iVar13 + lVar26]].r -
                             (fVar3 * fVar9 + fVar4 * fVar40 +
                             fVar35 * sVar36.r + fVar37 * -sVar36.i +
                             fVar30 * sVar33.r + fVar34 * -sVar33.i);
                  sVar42.i = dense[local_c8[iVar13 + lVar26]].i -
                             (fVar3 * fVar38 + fVar4 * fVar9 +
                             fVar35 * sVar36.i + fVar37 * sVar36.r +
                             fVar30 * sVar33.i + fVar34 * sVar33.r);
                  dense[local_c8[iVar13 + lVar26]] = sVar42;
                  lVar1 = iVar13 + lVar26;
                  lVar26 = lVar26 + 1;
                } while (lVar1 + 1 < lVar12);
              }
            }
          }
          else {
            uVar10 = (~uVar10 - iVar23) + ldm;
            iVar21 = iVar21 + (iVar20 - iVar22);
            uVar14 = (ulong)((iVar29 - iVar20) + 1);
            uVar19 = 0;
            do {
              tempv[uVar19] = dense[local_c8[(long)iVar21 + uVar19]];
              uVar19 = uVar19 + 1;
            } while (uVar14 != uVar19);
            local_50 = (long)((ldm + 1) * (iVar20 - iVar22) + iVar17);
            local_84 = ncol;
            clsolve(ldm,ncol,(singlecomplex *)((long)local_d0 + local_50 * 8),tempv);
            psVar16 = local_b0 + local_84;
            cmatvec(ldm,uVar10,local_84,
                    (singlecomplex *)((long)local_d0 + (long)(int)((int)local_50 + local_84) * 8),
                    local_b0,psVar16);
            uVar19 = 0;
            iVar29 = iVar21;
            do {
              dense[local_c8[(long)iVar21 + uVar19]] = local_b0[uVar19];
              local_b0[uVar19].r = 0.0;
              local_b0[uVar19].i = 0.0;
              uVar19 = uVar19 + 1;
              iVar29 = iVar29 + 1;
            } while (uVar14 != uVar19);
            tempv = local_b0;
            if (0 < (int)uVar10) {
              uVar19 = 0;
              do {
                sVar32.r = dense[local_c8[(long)iVar29 + uVar19]].r - psVar16[uVar19].r;
                sVar32.i = dense[local_c8[(long)iVar29 + uVar19]].i - psVar16[uVar19].i;
                dense[local_c8[(long)iVar29 + uVar19]] = sVar32;
                psVar16[uVar19].r = 0.0;
                psVar16[uVar19].i = 0.0;
                uVar19 = uVar19 + 1;
              } while (uVar19 < uVar10);
            }
          }
        }
      }
      uVar14 = (long)local_90 - 1;
      uVar10 = (int)local_98 + 1;
      uVar19 = (ulong)uVar10;
    } while (uVar10 != nseg);
  }
  iVar29 = local_a0[local_78];
  iVar13 = local_70[local_68];
  iVar22 = local_a8[iVar13];
  iVar21 = local_a8[(long)iVar13 + 1];
  iVar20 = (iVar21 + iVar29) - iVar22;
  if (local_88 < iVar20) {
    do {
      iVar11 = cLUMemXpand(jcol,iVar29,LUSUP,&local_b4,Glu);
      if (iVar11 != 0) {
        return iVar11;
      }
    } while (local_b4 < iVar20);
    local_c8 = Glu->lsub;
    local_d0 = Glu->lusup;
    iVar22 = local_a8[iVar13];
    iVar21 = local_a8[(long)iVar13 + 1];
  }
  if (iVar22 < iVar21) {
    lVar12 = (long)iVar22;
    psVar16 = (singlecomplex *)((long)local_d0 + (long)iVar29 * 8);
    do {
      iVar22 = local_c8[lVar12];
      *psVar16 = dense[iVar22];
      dense[iVar22].r = 0.0;
      dense[iVar22].i = 0.0;
      lVar12 = lVar12 + 1;
      psVar16 = psVar16 + 1;
      iVar29 = iVar29 + 1;
    } while (lVar12 < local_a8[(long)iVar13 + 1]);
  }
  if (fpanelc < iVar13) {
    fpanelc = iVar13;
  }
  local_a0[local_78 + 1] = iVar29;
  iVar29 = jcol - fpanelc;
  if (iVar29 != 0 && fpanelc <= jcol) {
    iVar22 = local_a0[fpanelc];
    iVar20 = local_a8[(long)iVar13 + 1] - local_a8[iVar13];
    uVar10 = (iVar13 - jcol) + iVar20;
    iVar21 = local_a0[local_78];
    local_60[0x13] = (float)((iVar29 + -1) * iVar29 * 4) + local_60[0x13];
    local_98 = (long)iVar22 + (long)(fpanelc - iVar13);
    lVar12 = (long)iVar21 + (long)(fpanelc - iVar13);
    local_60[0x14] = (float)(int)(iVar29 * uVar10 * 8) + local_60[0x14];
    local_90 = (singlecomplex *)((long)local_d0 + lVar12 * 8);
    clsolve(iVar20,iVar29,(singlecomplex *)((long)local_d0 + local_98 * 8),local_90);
    psVar16 = local_b0;
    cmatvec(iVar20,uVar10,iVar29,
            (singlecomplex *)((long)local_d0 + (long)((int)local_98 + iVar29) * 8),local_90,local_b0
           );
    if (0 < (int)uVar10) {
      iVar29 = (int)lVar12 + iVar29;
      uVar19 = 0;
      do {
        uVar7 = *(undefined8 *)((long)local_d0 + uVar19 * 8 + (long)iVar29 * 8);
        sVar32 = psVar16[uVar19];
        *(ulong *)((long)local_d0 + uVar19 * 8 + (long)iVar29 * 8) =
             CONCAT44((float)((ulong)uVar7 >> 0x20) - sVar32.i,(float)uVar7 - sVar32.r);
        psVar2 = psVar16 + uVar19;
        psVar2->r = 0.0;
        psVar2->i = 0.0;
        uVar19 = uVar19 + 1;
      } while (uVar19 < uVar10);
    }
  }
  return 0;
}

Assistant:

int
ccolumn_bmod (
	     const int  jcol,	  /* in */
	     const int  nseg,	  /* in */
	     singlecomplex     *dense,	  /* in */
	     singlecomplex     *tempv,	  /* working array */
	     int        *segrep,  /* in */
	     int        *repfnz,  /* in */
	     int        fpanelc,  /* in -- first column in the current panel */
	     GlobalLU_t *Glu,     /* modified */
	     SuperLUStat_t *stat  /* output */
	     )
{

#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
         ftcs2 = _cptofcd("N", strlen("N")),
         ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int         incx = 1, incy = 1;
    singlecomplex      alpha, beta;
    
    /* krep = representative of current k-th supernode
     * fsupc = first supernodal column
     * nsupc = no of columns in supernode
     * nsupr = no of rows in supernode (used as leading dimension)
     * luptr = location of supernodal LU-block in storage
     * kfnz = first nonz in the k-th supernodal segment
     * no_zeros = no of leading zeros in a supernodal U-segment
     */
    singlecomplex      ukj, ukj1, ukj2;
    int_t        luptr, luptr1, luptr2;
    int          fsupc, nsupc, nsupr, segsze;
    int          nrow;	  /* No of rows in the matrix of matrix-vector */
    int          jcolp1, jsupno, k, ksub, krep, krep_ind, ksupno;
    int_t        lptr, kfnz, isub, irow, i;
    int_t        no_zeros, new_next, ufirst, nextlu;
    int          fst_col; /* First column within small LU update */
    int          d_fsupc; /* Distance between the first column of the current
			     panel and the first column of the current snode. */
    int          *xsup, *supno;
    int_t        *lsub, *xlsub;
    singlecomplex       *lusup;
    int_t        *xlusup;
    int_t        nzlumax;
    singlecomplex       *tempv1;
    singlecomplex      zero = {0.0, 0.0};
    singlecomplex      one = {1.0, 0.0};
    singlecomplex      none = {-1.0, 0.0};
    singlecomplex	 comp_temp, comp_temp1;
    int_t        mem_error;
    flops_t      *ops = stat->ops;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (singlecomplex *) Glu->lusup;
    xlusup  = Glu->xlusup;
    nzlumax = Glu->nzlumax;
    jcolp1 = jcol + 1;
    jsupno = supno[jcol];
    
    /* 
     * For each nonz supernode segment of U[*,j] in topological order 
     */
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) {

	krep = segrep[k];
	k--;
	ksupno = supno[krep];
	if ( jsupno != ksupno ) { /* Outside the rectangular supernode */

	    fsupc = xsup[ksupno];
	    fst_col = SUPERLU_MAX ( fsupc, fpanelc );

  	    /* Distance from the current supernode to the current panel; 
	       d_fsupc=0 if fsupc > fpanelc. */
  	    d_fsupc = fst_col - fsupc; 

	    luptr = xlusup[fst_col] + d_fsupc;
	    lptr = xlsub[fsupc] + d_fsupc;

	    kfnz = repfnz[krep];
	    kfnz = SUPERLU_MAX ( kfnz, fpanelc );

	    segsze = krep - kfnz + 1;
	    nsupc = krep - fst_col + 1;
	    nsupr = xlsub[fsupc+1] - xlsub[fsupc];	/* Leading dimension */
	    nrow = nsupr - d_fsupc - nsupc;
	    krep_ind = lptr + nsupc - 1;




	    /* 
	     * Case 1: Update U-segment of size 1 -- col-col update 
	     */
	    if ( segsze == 1 ) {
	  	ukj = dense[lsub[krep_ind]];
		luptr += nsupr*(nsupc-1) + nsupc;

		for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    irow = lsub[i];
		    cc_mult(&comp_temp, &ukj, &lusup[luptr]);
		    c_sub(&dense[irow], &dense[irow], &comp_temp);
		    luptr++;
		}

	    } else if ( segsze <= 3 ) {
		ukj = dense[lsub[krep_ind]];
		luptr += nsupr*(nsupc-1) + nsupc-1;
		ukj1 = dense[lsub[krep_ind - 1]];
		luptr1 = luptr - nsupr;

		if ( segsze == 2 ) { /* Case 2: 2cols-col update */
		    cc_mult(&comp_temp, &ukj1, &lusup[luptr1]);
		    c_sub(&ukj, &ukj, &comp_temp);
		    dense[lsub[krep_ind]] = ukj;
		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    	irow = lsub[i];
		    	luptr++;
		    	luptr1++;
			cc_mult(&comp_temp, &ukj, &lusup[luptr]);
			cc_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			c_add(&comp_temp, &comp_temp, &comp_temp1);
			c_sub(&dense[irow], &dense[irow], &comp_temp);
		    }
		} else { /* Case 3: 3cols-col update */
		    ukj2 = dense[lsub[krep_ind - 2]];
		    luptr2 = luptr1 - nsupr;
  		    cc_mult(&comp_temp, &ukj2, &lusup[luptr2-1]);
		    c_sub(&ukj1, &ukj1, &comp_temp);

		    cc_mult(&comp_temp, &ukj1, &lusup[luptr1]);
		    cc_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
		    c_add(&comp_temp, &comp_temp, &comp_temp1);
		    c_sub(&ukj, &ukj, &comp_temp);

		    dense[lsub[krep_ind]] = ukj;
		    dense[lsub[krep_ind-1]] = ukj1;
		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    	irow = lsub[i];
		    	luptr++;
		    	luptr1++;
			luptr2++;
			cc_mult(&comp_temp, &ukj, &lusup[luptr]);
			cc_mult(&comp_temp1, &ukj1, &lusup[luptr1]);
			c_add(&comp_temp, &comp_temp, &comp_temp1);
			cc_mult(&comp_temp1, &ukj2, &lusup[luptr2]);
			c_add(&comp_temp, &comp_temp, &comp_temp1);
			c_sub(&dense[irow], &dense[irow], &comp_temp);
		    }
		}


	    } else {
	  	/*
		 * Case: sup-col update
		 * Perform a triangular solve and block update,
		 * then scatter the result of sup-col update to dense
		 */

		no_zeros = kfnz - fst_col;

	        /* Copy U[*,j] segment from dense[*] to tempv[*] */
	        isub = lptr + no_zeros;
	        for (i = 0; i < segsze; i++) {
	  	    irow = lsub[isub];
		    tempv[i] = dense[irow];
		    ++isub; 
	        }

	        /* Dense triangular solve -- start effective triangle */
		luptr += nsupr * no_zeros + no_zeros; 
		
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		CTRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
		       &nsupr, tempv, &incx );
#else		
		ctrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
		       &nsupr, tempv, &incx );
#endif		
 		luptr += segsze;  /* Dense matrix-vector */
		tempv1 = &tempv[segsze];
                alpha = one;
                beta = zero;
#ifdef _CRAY
		CGEMV( ftcs2, &nrow, &segsze, &alpha, &lusup[luptr], 
		       &nsupr, tempv, &incx, &beta, tempv1, &incy );
#else
		cgemv_( "N", &nrow, &segsze, &alpha, &lusup[luptr], 
		       &nsupr, tempv, &incx, &beta, tempv1, &incy );
#endif
#else
		clsolve ( nsupr, segsze, &lusup[luptr], tempv );

 		luptr += segsze;  /* Dense matrix-vector */
		tempv1 = &tempv[segsze];
		cmatvec (nsupr, nrow , segsze, &lusup[luptr], tempv, tempv1);
#endif
		
		
                /* Scatter tempv[] into SPA dense[] as a temporary storage */
                isub = lptr + no_zeros;
                for (i = 0; i < segsze; i++) {
                    irow = lsub[isub];
                    dense[irow] = tempv[i];
                    tempv[i] = zero;
                    ++isub;
                }

		/* Scatter tempv1[] into SPA dense[] */
		for (i = 0; i < nrow; i++) {
		    irow = lsub[isub];
		    c_sub(&dense[irow], &dense[irow], &tempv1[i]);
		    tempv1[i] = zero;
		    ++isub;
		}
	    }
	    
	} /* if jsupno ... */

    } /* for each segment... */

    /*
     *	Process the supernodal portion of L\U[*,j]
     */
    nextlu = xlusup[jcol];
    fsupc = xsup[jsupno];

    /* Copy the SPA dense into L\U[*,j] */
    new_next = nextlu + xlsub[fsupc+1] - xlsub[fsupc];
    while ( new_next > nzlumax ) {
	mem_error = cLUMemXpand(jcol, nextlu, LUSUP, &nzlumax, Glu);
	if (mem_error) return (mem_error);
	lusup = (singlecomplex *) Glu->lusup;
	lsub = Glu->lsub;
    }

    for (isub = xlsub[fsupc]; isub < xlsub[fsupc+1]; isub++) {
  	irow = lsub[isub];
	lusup[nextlu] = dense[irow];
        dense[irow] = zero;
	++nextlu;
    }

    xlusup[jcolp1] = nextlu;	/* Close L\U[*,jcol] */

    /* For more updates within the panel (also within the current supernode), 
     * should start from the first column of the panel, or the first column 
     * of the supernode, whichever is bigger. There are 2 cases:
     *    1) fsupc < fpanelc, then fst_col := fpanelc
     *    2) fsupc >= fpanelc, then fst_col := fsupc
     */
    fst_col = SUPERLU_MAX ( fsupc, fpanelc );

    if ( fst_col < jcol ) {

  	/* Distance between the current supernode and the current panel.
	   d_fsupc=0 if fsupc >= fpanelc. */
  	d_fsupc = fst_col - fsupc;

	lptr = xlsub[fsupc] + d_fsupc;
	luptr = xlusup[fst_col] + d_fsupc;
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];	/* Leading dimension */
	nsupc = jcol - fst_col;	/* Excluding jcol */
	nrow = nsupr - d_fsupc - nsupc;

	/* Points to the beginning of jcol in snode L\U(jsupno) */
	ufirst = xlusup[jcol] + d_fsupc;	

	ops[TRSV] += 4 * nsupc * (nsupc - 1);
	ops[GEMV] += 8 * nrow * nsupc;
	
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
	CTRSV( ftcs1, ftcs2, ftcs3, &nsupc, &lusup[luptr], 
	       &nsupr, &lusup[ufirst], &incx );
#else
	ctrsv_( "L", "N", "U", &nsupc, &lusup[luptr], 
	       &nsupr, &lusup[ufirst], &incx );
#endif
	
	alpha = none; beta = one; /* y := beta*y + alpha*A*x */

#ifdef _CRAY
	CGEMV( ftcs2, &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr,
	       &lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#else
	cgemv_( "N", &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr,
	       &lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#endif
#else
	clsolve ( nsupr, nsupc, &lusup[luptr], &lusup[ufirst] );

	cmatvec ( nsupr, nrow, nsupc, &lusup[luptr+nsupc],
		&lusup[ufirst], tempv );
	
        /* Copy updates from tempv[*] into lusup[*] */
	isub = ufirst + nsupc;
	for (i = 0; i < nrow; i++) {
	    c_sub(&lusup[isub], &lusup[isub], &tempv[i]);
	    tempv[i] = zero;
	    ++isub;
	}

#endif
	
	
    } /* if fst_col < jcol ... */ 

    return 0;
}